

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void api_suite::run(void)

{
  api_ctor_default();
  api_capacity();
  api_size();
  api_empty();
  api_full();
  api_clear();
  api_insert_value();
  api_insert_hint();
  api_emplace_value();
  api_emplace_value();
  api_emplace_hint();
  api_erase_key();
  api_contains();
  api_find();
  api_lower_bound();
  api_index_operator();
  api_begin_end();
  api_begin_end_const();
  api_cbegin_cend();
  api_key_comp();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_capacity();
    api_size();
    api_empty();
    api_full();
    api_clear();
    api_insert_value();
    api_insert_hint();
    api_emplace_value();
    api_emplace_value();
    api_emplace_hint();
    api_erase_key();
    api_contains();
    api_find();
    api_lower_bound();
    api_index_operator();
    api_begin_end();
    api_begin_end_const();
    api_cbegin_cend();
    api_key_comp();
}